

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerImpl::~CommissionerImpl(CommissionerImpl *this)

{
  ~CommissionerImpl(this);
  operator_delete(this);
  return;
}

Assistant:

~CommissionerImpl() override = default;